

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall glcts::anon_unknown_0::BasicMax::Check(BasicMax *this,GLenum target,GLint min_value)

{
  ulong uVar1;
  CallLogWrapper *this_00;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLint64 i64;
  GLboolean local_31;
  float local_30;
  uint local_2c;
  uint local_28 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,target,(GLint *)&local_2c);
  uVar1 = (ulong)local_2c;
  if (min_value <= (int)local_2c) {
    glu::CallLogWrapper::glGetInteger64v(this_00,target,(GLint64 *)local_28);
    uVar1 = (ulong)local_28[0];
    if (min_value <= (int)local_28[0]) {
      glu::CallLogWrapper::glGetFloatv(this_00,target,&local_30);
      uVar1 = (ulong)(uint)(int)local_30;
      if (min_value <= (int)local_30) {
        glu::CallLogWrapper::glGetBooleanv(this_00,target,&local_31);
        if (local_31 != '\0') {
          return true;
        }
        anon_unknown_0::Output("Is GL_FALSE should be at least GL_TRUE.\n");
        return false;
      }
    }
  }
  anon_unknown_0::Output("Is %d should be at least %d.\n",uVar1,(ulong)(uint)min_value);
  return false;
}

Assistant:

bool Check(GLenum target, const GLint min_value)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLboolean b;

		glGetIntegerv(target, &i);
		if (i < min_value)
		{
			Output("Is %d should be at least %d.\n", i, min_value);
			return false;
		}
		glGetInteger64v(target, &i64);
		if (static_cast<GLint>(i64) < min_value)
		{
			Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_value);
			return false;
		}
		glGetFloatv(target, &f);
		if (static_cast<GLint>(f) < min_value)
		{
			Output("Is %d should be at least %d.\n", static_cast<GLint>(f), min_value);
			return false;
		}
		glGetBooleanv(target, &b);
		if (b == GL_FALSE)
		{
			Output("Is GL_FALSE should be at least GL_TRUE.\n");
			return false;
		}

		return true;
	}